

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>>::
emplaceValue<QStyleSheetStyleCaches::Tampered<QPalette>const&>
          (Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_> *this,
          Tampered<QPalette> *args)

{
  long lVar1;
  Tampered<QPalette> *in_RDI;
  long in_FS_OFFSET;
  Tampered<QPalette> *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QStyleSheetStyleCaches::Tampered<QPalette>::Tampered(in_RDI,in_stack_ffffffffffffffb8);
  QStyleSheetStyleCaches::Tampered<QPalette>::operator=(in_RDI,in_stack_ffffffffffffffb8);
  QStyleSheetStyleCaches::Tampered<QPalette>::~Tampered((Tampered<QPalette> *)0x47680b);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }